

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

JitTypePropertyGuard * __thiscall Func::GetOrCreateSingleTypeGuard(Func *this,intptr_t typeAddr)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertyGuard *this_00;
  intptr_t local_38;
  intptr_t typeAddr_local;
  JitTypePropertyGuard *guard;
  
  local_38 = typeAddr;
  EnsureSingleTypeGuards(this);
  typeAddr_local = 0;
  bVar3 = JsUtil::
          BaseDictionary<long,_Js::JitTypePropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<long>(this->singleTypeGuards,&local_38,
                              (JitTypePropertyGuard **)&typeAddr_local);
  if (bVar3) {
    if (*(long *)typeAddr_local != local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x636,"(guard->GetTypeAddr() == typeAddr)",
                         "guard->GetTypeAddr() == typeAddr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    this_00 = (PropertyGuard *)
              new<NativeCodeData::AllocatorNoFixup<Js::JitTypePropertyGuard>>
                        (0x10,(AllocatorNoFixup<Js::JitTypePropertyGuard> *)
                              &this->topFunc->nativeCodeDataAllocator,0x431f3e);
    iVar1 = this->indexedPropertyGuardCount;
    this->indexedPropertyGuardCount = iVar1 + 1;
    Js::PropertyGuard::PropertyGuard(this_00,local_38);
    *(int *)&this_00->field_0xc = iVar1;
    typeAddr_local = (intptr_t)this_00;
    JsUtil::
    BaseDictionary<long,Js::JitTypePropertyGuard*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<long,Js::JitTypePropertyGuard*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<long,Js::JitTypePropertyGuard*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->singleTypeGuards,&local_38,(JitTypePropertyGuard **)&typeAddr_local);
  }
  return (JitTypePropertyGuard *)typeAddr_local;
}

Assistant:

Js::JitTypePropertyGuard*
Func::GetOrCreateSingleTypeGuard(intptr_t typeAddr)
{
    EnsureSingleTypeGuards();

    Js::JitTypePropertyGuard* guard = nullptr;
    if (!this->singleTypeGuards->TryGetValue(typeAddr, &guard))
    {
        // Property guards are allocated by NativeCodeData::Allocator so that their lifetime extends as long as the EntryPointInfo is alive.
        guard = NativeCodeDataNewNoFixup(GetNativeCodeDataAllocator(), Js::JitTypePropertyGuard, typeAddr, this->indexedPropertyGuardCount++);
        this->singleTypeGuards->Add(typeAddr, guard);
    }
    else
    {
        Assert(guard->GetTypeAddr() == typeAddr);
    }

    return guard;
}